

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ir.h
# Opt level: O2

void __thiscall wabt::ElemSegmentModuleField::~ElemSegmentModuleField(ElemSegmentModuleField *this)

{
  ~ElemSegmentModuleField(this);
  operator_delete(this);
  return;
}

Assistant:

explicit ElemSegmentModuleField(const Location& loc = Location(),
                                  string_view name = string_view())
      : ModuleFieldMixin<ModuleFieldType::ElemSegment>(loc),
        elem_segment(name) {}